

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivideTest.h
# Opt level: O2

void __thiscall
DivideTest<unsigned_int>::test_pow2_numerators<(libdivide::Branching)1>
          (DivideTest<unsigned_int> *this,uint denom,
          divider<unsigned_int,_(libdivide::Branching)1> *the_divider)

{
  int i;
  uint uVar1;
  int j;
  int iVar2;
  
  for (uVar1 = 1; uVar1 != 0x20; uVar1 = uVar1 + 1) {
    for (iVar2 = -1; iVar2 != 2; iVar2 = iVar2 + 1) {
      test_one<(libdivide::Branching)1>(this,(1 << (uVar1 & 0x1f)) + iVar2,denom,the_divider);
    }
  }
  return;
}

Assistant:

void test_pow2_numerators(T denom, const divider<T, ALGO> &the_divider) {
        // test power of 2 numerators: 2^i-1, 2^i, 2^i+1
        for (int i = 1; i < limits::digits; i++) {
            for (int j = -1; j <= 1; j++) {
                T numerator = static_cast<T>((static_cast<T>(1) << i) + j);
                test_one(numerator, denom, the_divider);

                if (limits::is_signed) {
                    test_one(-numerator, denom, the_divider);
                }
            }
        }
    }